

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::ReadQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  uchar *puVar7;
  void *this_00;
  byte local_a9;
  quadlet_t *packet_FW;
  uint boardId;
  int nRecv;
  uint recvPacketSize;
  uchar *recvPacket;
  uint sendPacketSize;
  uchar *sendPacket;
  int numFlushed;
  allocator<char> local_59;
  string local_58 [39];
  byte local_31;
  quadlet_t *pqStack_30;
  uchar flags_local;
  quadlet_t *data_local;
  nodeaddr_t addr_local;
  EthBasePort *pEStack_18;
  nodeid_t node_local;
  EthBasePort *this_local;
  
  local_a9 = 0;
  local_31 = flags;
  pqStack_30 = data;
  data_local = (quadlet_t *)addr;
  addr_local._6_2_ = node;
  pEStack_18 = this;
  if (node != 0x3f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"ReadQuadlet",&local_59);
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_58,0);
    local_a9 = (byte)iVar2 ^ 0xff;
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_a9 & 1) == 0) {
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2f])();
    if (0 < iVar2) {
      poVar6 = std::operator<<((this->super_BasePort).outStr,"ReadQuadlet: flushed ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," packets");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar7 = (this->super_BasePort).GenericBuffer;
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
    puVar7 = puVar7 + uVar3;
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    uVar3 = iVar2 + 0x10;
    (*(this->super_BasePort)._vptr_BasePort[0x31])
              (this,puVar7,(ulong)uVar3,(ulong)addr_local._6_2_,(ulong)local_31);
    make_write_header(this,puVar7,uVar3,local_31);
    uVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_qread_packet(this,(quadlet_t *)(puVar7 + uVar4),addr_local._6_2_,(nodeaddr_t)data_local,
                      (uint)this->fw_tl);
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,(ulong)addr_local._6_2_,puVar7,(ulong)uVar3,
                       (ulong)((local_31 & 0x80) != 0));
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else if ((this->eth_read_callback == (EthCallbackType)0x0) ||
            (bVar1 = (*this->eth_read_callback)
                               (this,(uchar)addr_local._6_2_,(this->super_BasePort).outStr), bVar1))
    {
      puVar7 = (this->super_BasePort).GenericBuffer;
      uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x18])();
      puVar7 = puVar7 + uVar3;
      iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
      uVar3 = iVar2 + 0x1c;
      uVar4 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puVar7,(ulong)uVar3);
      if (uVar4 == uVar3) {
        uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
        ProcessExtraData(this,puVar7 + (ulong)uVar3 + 0x14);
        uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x32])
                          (this,puVar7,(ulong)((local_31 & 0x80) != 0));
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
          ByteswapQuadlets(this,puVar7 + uVar3,0x14);
          uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
          bVar1 = CheckFirewirePacket(this,puVar7 + uVar3,0,addr_local._6_2_,6,(uint)this->fw_tl);
          if (bVar1) {
            uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
            *pqStack_30 = *(quadlet_t *)(puVar7 + (ulong)uVar3 + 0xc);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        uVar5 = (uint)(this->super_BasePort).Node2Board[addr_local._6_2_];
        if (uVar5 < 0x10) {
          poVar6 = std::operator<<((this->super_BasePort).outStr,
                                   "ReadQuadlet: failed to receive read response from board ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
          poVar6 = std::operator<<(poVar6," via UDP: return value = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
          poVar6 = std::operator<<(poVar6,", expected = ");
          this_00 = (void *)std::ostream::operator<<(poVar6,uVar3);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
        this_local._7_1_ = false;
      }
    }
    else {
      poVar6 = std::operator<<((this->super_BasePort).outStr,
                               "ReadQuadlet: callback aborting (not reading packet)");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadQuadlet"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadQuadlet: flushed " << numFlushed << " packets" << std::endl;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    SetGenericBuffer();   // Make sure buffer is allocated

    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_QREAD_SIZE;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_qread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadQuadlet: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    unsigned char *recvPacket = GenericBuffer+GetReadQuadAlign();
    unsigned int recvPacketSize = GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE+FW_EXTRA_SIZE;
    int nRecv = PacketReceive(recvPacket, recvPacketSize);
    if (nRecv != static_cast<int>(recvPacketSize)) {
        // Only print message if Node2Board contains valid board number, to avoid unnecessary error messages during ScanNodes.
        unsigned int boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS) {
            outStr << "ReadQuadlet: failed to receive read response from board " << boardId
                   << " via UDP: return value = " << nRecv
                   << ", expected = " << recvPacketSize << std::endl;
        }
        return false;
    }

    ProcessExtraData(recvPacket+GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE);

    if (!CheckEthernetHeader(recvPacket, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;
    // Byteswap Firewire header (also swaps quadlet data)
    ByteswapQuadlets(recvPacket + GetPrefixOffset(RD_FW_HEADER), FW_QRESPONSE_SIZE);
    if (!CheckFirewirePacket(recvPacket+GetPrefixOffset(RD_FW_HEADER), 0, node, EthBasePort::QRESPONSE, fw_tl))
        return false;

    const quadlet_t *packet_FW = reinterpret_cast<const quadlet_t *>(recvPacket+GetPrefixOffset(RD_FW_HEADER));
    data = packet_FW[3];
    return true;
}